

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

bool __thiscall
kernel::BlockTreeDB::LoadBlockIndexGuts
          (BlockTreeDB *this,Params *consensusParams,
          function<CBlockIndex_*(const_uint256_&)> insertBlockIndex,SignalInterrupt *interrupt)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  CBlockIndex *this_00;
  CBlockIndex *pCVar5;
  undefined8 uVar6;
  SignalInterrupt *in_RCX;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> pcursor;
  uint256 local_198;
  CDiskBlockIndex local_178;
  pair<unsigned_char,_uint256> key;
  undefined1 local_88 [28];
  uchar auStack_6c [8];
  uchar local_64 [8];
  uchar auStack_5c [8];
  uchar local_54 [8];
  uchar auStack_4c [16];
  uint32_t local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcursor._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
  super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
  super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl =
       (__uniq_ptr_data<CDBIterator,_std::default_delete<CDBIterator>,_true,_true>)
       CDBWrapper::NewIterator(&this->super_CDBWrapper);
  local_178.super_CBlockIndex.pskip._1_1_ = '\0';
  local_178.super_CBlockIndex.pskip._2_1_ = '\0';
  local_178.super_CBlockIndex.pskip._3_1_ = '\0';
  local_178.super_CBlockIndex.pskip._4_1_ = '\0';
  local_178.super_CBlockIndex.pskip._5_1_ = '\0';
  local_178.super_CBlockIndex.pskip._6_1_ = '\0';
  local_178.super_CBlockIndex.pskip._7_1_ = '\0';
  local_178.super_CBlockIndex.nHeight._0_1_ = '\0';
  local_178.super_CBlockIndex._25_7_ = 0;
  local_178.super_CBlockIndex.nDataPos._0_1_ = '\0';
  local_178.super_CBlockIndex.phashBlock._1_1_ = '\0';
  local_178.super_CBlockIndex.phashBlock._2_1_ = '\0';
  local_178.super_CBlockIndex.phashBlock._3_1_ = '\0';
  local_178.super_CBlockIndex.phashBlock._4_1_ = '\0';
  local_178.super_CBlockIndex.phashBlock._5_1_ = '\0';
  local_178.super_CBlockIndex.phashBlock._6_1_ = '\0';
  local_178.super_CBlockIndex.phashBlock._7_1_ = '\0';
  local_178.super_CBlockIndex.pprev._0_1_ = '\0';
  local_178.super_CBlockIndex.pprev._1_1_ = '\0';
  local_178.super_CBlockIndex.pprev._2_1_ = '\0';
  local_178.super_CBlockIndex.pprev._3_1_ = '\0';
  local_178.super_CBlockIndex.pprev._4_1_ = '\0';
  local_178.super_CBlockIndex.pprev._5_1_ = '\0';
  local_178.super_CBlockIndex.pprev._6_1_ = '\0';
  local_178.super_CBlockIndex.pprev._7_1_ = '\0';
  local_178.super_CBlockIndex.pskip._0_1_ = '\0';
  local_178.super_CBlockIndex.phashBlock._0_1_ = 'b';
  CDBIterator::Seek<std::pair<unsigned_char,uint256>>
            ((CDBIterator *)
             pcursor._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t
             .super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
             super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,
             (pair<unsigned_char,_uint256> *)&local_178);
  while( true ) {
    bVar3 = CDBIterator::Valid((CDBIterator *)
                               pcursor._M_t.
                               super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>
                               .super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
    if (!bVar3) break;
    bVar4 = util::SignalInterrupt::operator_cast_to_bool(in_RCX);
    if (bVar4) break;
    key.second.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    key.first = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    bVar3 = CDBIterator::GetKey<std::pair<unsigned_char,uint256>>
                      ((CDBIterator *)
                       pcursor._M_t.
                       super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
                       super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                       super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,&key);
    if (!bVar3 || key.first != 'b') {
      bVar3 = true;
      goto LAB_00206fb4;
    }
    local_178.super_CBlockIndex.nChainWork.super_base_uint<256U>.pn[6] = 0;
    local_178.super_CBlockIndex.nChainWork.super_base_uint<256U>.pn[7] = 0;
    local_178.super_CBlockIndex.nTx = 0;
    local_178.super_CBlockIndex.nChainWork.super_base_uint<256U>.pn[2] = 0;
    local_178.super_CBlockIndex.nChainWork.super_base_uint<256U>.pn[3] = 0;
    local_178.super_CBlockIndex.nChainWork.super_base_uint<256U>.pn[4] = 0;
    local_178.super_CBlockIndex.nChainWork.super_base_uint<256U>.pn[5] = 0;
    local_178.super_CBlockIndex.nDataPos._0_1_ = '\0';
    local_178.super_CBlockIndex._33_7_ = 0;
    local_178.super_CBlockIndex.nChainWork.super_base_uint<256U>.pn[0] = 0;
    local_178.super_CBlockIndex.nChainWork.super_base_uint<256U>.pn[1] = 0;
    local_178.super_CBlockIndex.pskip._0_1_ = '\0';
    local_178.super_CBlockIndex.pskip._1_1_ = '\0';
    local_178.super_CBlockIndex.pskip._2_1_ = '\0';
    local_178.super_CBlockIndex.pskip._3_1_ = '\0';
    local_178.super_CBlockIndex.pskip._4_1_ = '\0';
    local_178.super_CBlockIndex.pskip._5_1_ = '\0';
    local_178.super_CBlockIndex.pskip._6_1_ = '\0';
    local_178.super_CBlockIndex.pskip._7_1_ = '\0';
    local_178.super_CBlockIndex.nHeight._0_1_ = '\0';
    local_178.super_CBlockIndex._25_7_ = 0;
    local_178.super_CBlockIndex.phashBlock._0_1_ = '\0';
    local_178.super_CBlockIndex.phashBlock._1_1_ = '\0';
    local_178.super_CBlockIndex.phashBlock._2_1_ = '\0';
    local_178.super_CBlockIndex.phashBlock._3_1_ = '\0';
    local_178.super_CBlockIndex.phashBlock._4_1_ = '\0';
    local_178.super_CBlockIndex.phashBlock._5_1_ = '\0';
    local_178.super_CBlockIndex.phashBlock._6_1_ = '\0';
    local_178.super_CBlockIndex.phashBlock._7_1_ = '\0';
    local_178.super_CBlockIndex.pprev._0_1_ = '\0';
    local_178.super_CBlockIndex.pprev._1_1_ = '\0';
    local_178.super_CBlockIndex.pprev._2_1_ = '\0';
    local_178.super_CBlockIndex.pprev._3_1_ = '\0';
    local_178.super_CBlockIndex.pprev._4_1_ = '\0';
    local_178.super_CBlockIndex.pprev._5_1_ = '\0';
    local_178.super_CBlockIndex.pprev._6_1_ = '\0';
    local_178.super_CBlockIndex.pprev._7_1_ = '\0';
    local_178._160_1_ = '\0';
    local_178._161_1_ = '\0';
    local_178._162_1_ = '\0';
    local_178._163_1_ = '\0';
    local_178._164_1_ = '\0';
    local_178._165_1_ = '\0';
    local_178._166_1_ = '\0';
    local_178._167_1_ = '\0';
    local_178._168_1_ = '\0';
    local_178._169_1_ = '\0';
    local_178._170_1_ = '\0';
    local_178._171_1_ = '\0';
    local_178._172_4_ = 0;
    local_178.super_CBlockIndex.nTimeMax = 0;
    local_178.super_CBlockIndex._148_1_ = '\0';
    local_178.super_CBlockIndex._149_1_ = '\0';
    local_178.super_CBlockIndex._150_1_ = '\0';
    local_178.super_CBlockIndex._151_1_ = '\0';
    local_178._152_1_ = '\0';
    local_178._153_1_ = '\0';
    local_178._154_1_ = '\0';
    local_178._155_1_ = '\0';
    local_178._156_1_ = '\0';
    local_178._157_1_ = '\0';
    local_178._158_1_ = '\0';
    local_178._159_1_ = '\0';
    local_178.super_CBlockIndex.nTime = 0;
    local_178.super_CBlockIndex.nBits = 0;
    local_178.super_CBlockIndex.nNonce = 0;
    local_178.super_CBlockIndex.nSequenceId = 0;
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_178.super_CBlockIndex.m_chain_tx_count = 0;
    local_178.super_CBlockIndex.nStatus = 0;
    local_178.super_CBlockIndex.nVersion = 0;
    local_178._176_4_ = 0;
    bVar3 = CDBIterator::GetValue<CDiskBlockIndex>
                      ((CDBIterator *)
                       pcursor._M_t.
                       super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
                       super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                       super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,&local_178);
    if (!bVar3) {
      logging_function._M_str = "LoadBlockIndexGuts";
      logging_function._M_len = 0x12;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file._M_len = 0x65;
      LogPrintFormatInternal<char[19]>
                (logging_function,source_file,0x8d,ALL,Error,(ConstevalFormatString<1U>)0x7d734b,
                 (char (*) [19])"LoadBlockIndexGuts");
LAB_00206fb1:
      bVar3 = false;
      goto LAB_00206fb4;
    }
    local_88._0_4_ = local_178.super_CBlockIndex.nVersion;
    auStack_6c._4_4_ = local_178._176_4_;
    auStack_6c._0_4_ = local_178._172_4_;
    local_88._20_4_ = local_178._164_4_;
    local_88._24_4_ = local_178._168_4_;
    local_88._4_4_ = local_178.super_CBlockIndex._148_4_;
    local_88._8_4_ = local_178._152_4_;
    local_88._12_4_ = local_178._156_4_;
    local_88._16_4_ = local_178._160_4_;
    local_54[0] = local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x10];
    local_54[1] = local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x11];
    local_54[2] = local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x12];
    local_54[3] = local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x13];
    local_54[4] = local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x14];
    local_54[5] = local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x15];
    local_54[6] = local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x16];
    local_54[7] = local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x17];
    auStack_4c[0] =
         local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18];
    auStack_4c[1] =
         local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19];
    auStack_4c[2] =
         local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a];
    auStack_4c[3] =
         local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b];
    auStack_4c[4] =
         local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c];
    auStack_4c[5] =
         local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d];
    auStack_4c[6] =
         local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e];
    auStack_4c[7] =
         local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f];
    local_64[0] = local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0];
    local_64[1] = local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [1];
    local_64[2] = local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [2];
    local_64[3] = local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [3];
    local_64[4] = local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [4];
    local_64[5] = local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [5];
    local_64[6] = local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [6];
    local_64[7] = local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [7];
    auStack_5c[0] =
         local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8];
    auStack_5c[1] =
         local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9];
    auStack_5c[2] =
         local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10];
    auStack_5c[3] =
         local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb];
    auStack_5c[4] =
         local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc];
    auStack_5c[5] =
         local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd];
    auStack_5c[6] =
         local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe];
    auStack_5c[7] =
         local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf];
    auStack_4c._12_4_ = local_178.super_CBlockIndex.nBits;
    auStack_4c._8_4_ = local_178.super_CBlockIndex.nTime;
    local_3c = local_178.super_CBlockIndex.nNonce;
    CBlockHeader::GetHash(&local_198,(CBlockHeader *)local_88);
    lVar1._0_4_ = interrupt[1].m_pipe_r;
    lVar1._4_4_ = interrupt[1].m_pipe_w;
    if (lVar1 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_function_call();
LAB_00207006:
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      goto LAB_002070cd;
    }
    this_00 = (CBlockIndex *)(**(code **)(interrupt + 2))(interrupt,&local_198);
    lVar2._0_4_ = interrupt[1].m_pipe_r;
    lVar2._4_4_ = interrupt[1].m_pipe_w;
    if (lVar2 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        uVar6 = std::__throw_bad_function_call();
        if ((undefined1 *)CONCAT44(local_88._4_4_,local_88._0_4_) != local_88 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_88._4_4_,local_88._0_4_),
                          CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
        }
        std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::~unique_ptr(&pcursor);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          _Unwind_Resume(uVar6);
        }
      }
      goto LAB_002070cd;
    }
    pCVar5 = (CBlockIndex *)
             (**(code **)(interrupt + 2))(interrupt,&local_178.super_CBlockIndex.field_0x94);
    this_00->pprev = pCVar5;
    this_00->nHeight =
         (int)CONCAT71(local_178.super_CBlockIndex._25_7_,(uchar)local_178.super_CBlockIndex.nHeight
                      );
    this_00->nFile = local_178.super_CBlockIndex.nFile;
    this_00->nDataPos =
         (int)CONCAT71(local_178.super_CBlockIndex._33_7_,
                       (uchar)local_178.super_CBlockIndex.nDataPos);
    this_00->nUndoPos = local_178.super_CBlockIndex.nUndoPos;
    this_00->nVersion = local_178.super_CBlockIndex.nVersion;
    *(undefined8 *)(this_00->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems =
         local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)((this_00->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 8) =
         local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._8_8_;
    *(undefined8 *)((this_00->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)((this_00->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x18) =
         local_178.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._24_8_;
    this_00->nTime = local_178.super_CBlockIndex.nTime;
    this_00->nBits = local_178.super_CBlockIndex.nBits;
    this_00->nNonce = local_178.super_CBlockIndex.nNonce;
    this_00->nStatus = local_178.super_CBlockIndex.nStatus;
    this_00->nTx = local_178.super_CBlockIndex.nTx;
    if (this_00->phashBlock == (uint256 *)0x0) goto LAB_00207006;
    bVar3 = CheckProofOfWork((base_blob<256U>)
                             *(base_blob<256U> *)
                              (this_00->phashBlock->super_base_blob<256U>).m_data._M_elems,
                             local_178.super_CBlockIndex.nBits,consensusParams);
    if (!bVar3) {
      CBlockIndex::ToString_abi_cxx11_((string *)local_88,this_00);
      logging_function_00._M_str = "LoadBlockIndexGuts";
      logging_function_00._M_len = 0x12;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file_00._M_len = 0x65;
      LogPrintFormatInternal<char[19],std::__cxx11::string>
                (logging_function_00,source_file_00,0x87,ALL,Error,
                 (ConstevalFormatString<2U>)0x7d732a,(char (*) [19])"LoadBlockIndexGuts",
                 (string *)local_88);
      if ((undefined1 *)CONCAT44(local_88._4_4_,local_88._0_4_) != local_88 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_88._4_4_,local_88._0_4_),
                        CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
      }
      goto LAB_00206fb1;
    }
    CDBIterator::Next((CDBIterator *)
                      pcursor._M_t.
                      super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
                      super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                      super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
  }
  bVar3 = !bVar3;
LAB_00206fb4:
  std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::~unique_ptr(&pcursor);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
LAB_002070cd:
  __stack_chk_fail();
}

Assistant:

bool BlockTreeDB::LoadBlockIndexGuts(const Consensus::Params& consensusParams, std::function<CBlockIndex*(const uint256&)> insertBlockIndex, const util::SignalInterrupt& interrupt)
{
    AssertLockHeld(::cs_main);
    std::unique_ptr<CDBIterator> pcursor(NewIterator());
    pcursor->Seek(std::make_pair(DB_BLOCK_INDEX, uint256()));

    // Load m_block_index
    while (pcursor->Valid()) {
        if (interrupt) return false;
        std::pair<uint8_t, uint256> key;
        if (pcursor->GetKey(key) && key.first == DB_BLOCK_INDEX) {
            CDiskBlockIndex diskindex;
            if (pcursor->GetValue(diskindex)) {
                // Construct block index object
                CBlockIndex* pindexNew = insertBlockIndex(diskindex.ConstructBlockHash());
                pindexNew->pprev          = insertBlockIndex(diskindex.hashPrev);
                pindexNew->nHeight        = diskindex.nHeight;
                pindexNew->nFile          = diskindex.nFile;
                pindexNew->nDataPos       = diskindex.nDataPos;
                pindexNew->nUndoPos       = diskindex.nUndoPos;
                pindexNew->nVersion       = diskindex.nVersion;
                pindexNew->hashMerkleRoot = diskindex.hashMerkleRoot;
                pindexNew->nTime          = diskindex.nTime;
                pindexNew->nBits          = diskindex.nBits;
                pindexNew->nNonce         = diskindex.nNonce;
                pindexNew->nStatus        = diskindex.nStatus;
                pindexNew->nTx            = diskindex.nTx;

                if (!CheckProofOfWork(pindexNew->GetBlockHash(), pindexNew->nBits, consensusParams)) {
                    LogError("%s: CheckProofOfWork failed: %s\n", __func__, pindexNew->ToString());
                    return false;
                }

                pcursor->Next();
            } else {
                LogError("%s: failed to read value\n", __func__);
                return false;
            }
        } else {
            break;
        }
    }

    return true;
}